

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu541.c
# Opt level: O1

MPP_RET hal_h264e_vepu541_wait(void *hal,HalEncTask *task)

{
  uint uVar1;
  MppPacket s;
  long lVar2;
  MPP_RET MVar3;
  size_t sVar4;
  HalH264eVepu541Ctx *ctx;
  
  s = task->packet;
  uVar1 = *(uint *)&task->rc_task->frm;
  sVar4 = mpp_packet_get_length(s);
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter %p\n","hal_h264e_vepu541_wait",hal);
  }
  MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),0x10,(void *)0x0);
  if (MVar3 == MPP_OK) {
    if (((*(byte *)((long)hal + 0x80c) & 2) != 0) && (((byte)hal_h264e_debug & 8) != 0)) {
      _mpp_log_l(4,"hal_h264e_vepu541","lkt_done finish","hal_h264e_vepu541_status_check");
    }
    if (((*(byte *)((long)hal + 0x80c) & 1) != 0) && (((byte)hal_h264e_debug & 8) != 0)) {
      _mpp_log_l(4,"hal_h264e_vepu541","enc_done finish","hal_h264e_vepu541_status_check");
    }
    if (((*(byte *)((long)hal + 0x80c) & 8) != 0) && (((byte)hal_h264e_debug & 8) != 0)) {
      _mpp_log_l(4,"hal_h264e_vepu541","enc_slice finsh","hal_h264e_vepu541_status_check");
    }
    if (((*(byte *)((long)hal + 0x80c) & 4) != 0) && (((byte)hal_h264e_debug & 8) != 0)) {
      _mpp_log_l(4,"hal_h264e_vepu541","safe clear finsh","hal_h264e_vepu541_status_check");
    }
    if ((*(byte *)((long)hal + 0x80c) & 0x10) != 0) {
      _mpp_log_l(2,"hal_h264e_vepu541","bit stream overflow","hal_h264e_vepu541_status_check");
    }
    if ((*(byte *)((long)hal + 0x80c) & 0x20) != 0) {
      _mpp_log_l(2,"hal_h264e_vepu541","bus write full","hal_h264e_vepu541_status_check");
    }
    if ((*(byte *)((long)hal + 0x80c) & 0x40) != 0) {
      _mpp_log_l(2,"hal_h264e_vepu541","bus write error","hal_h264e_vepu541_status_check");
    }
    if ((*(byte *)((long)hal + 0x80c) & 0x80) != 0) {
      _mpp_log_l(2,"hal_h264e_vepu541","bus read error","hal_h264e_vepu541_status_check");
    }
    if ((*(byte *)((long)hal + 0x80d) & 1) != 0) {
      _mpp_log_l(2,"hal_h264e_vepu541","wdg timeout","hal_h264e_vepu541_status_check");
    }
    task->hw_length = task->hw_length + (*(uint *)((long)hal + 0x810) & 0x7ffffff);
    MVar3 = MPP_OK;
  }
  else {
    _mpp_log_l(2,"hal_h264e_vepu541","poll cmd failed %d\n","hal_h264e_vepu541_wait",
               (ulong)(uint)MVar3);
    MVar3 = MPP_ERR_VPUHW;
  }
  mpp_packet_add_segment_info
            (s,((uVar1 & 0x20) >> 3) + 1,(RK_S32)sVar4,*(uint *)((long)hal + 0x810) & 0x7ffffff);
  if (*(int *)((long)hal + 0x70) == 0) {
    if (*(long *)((long)hal + 0x80) != 0) {
      *(RK_S32 *)((long)hal + 0xc4) = task->hw_length;
      h264e_vepu_stream_amend_sync_ref_idc((HalH264eVepuStreamAmend *)((long)hal + 0x70));
    }
  }
  else {
    *(RK_S32 *)((long)hal + 0xc4) = task->hw_length;
    lVar2 = *hal;
    *(uint *)(*(long *)((long)hal + 0x78) + 0x88) = (uint)(*(int *)(lVar2 + 0xe94) != 0);
    h264e_vepu_stream_amend_proc
              ((HalH264eVepuStreamAmend *)((long)hal + 0x70),(MppEncH264HwCfg *)(lVar2 + 0x360));
    task->hw_length = *(RK_S32 *)((long)hal + 200);
  }
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","leave %p\n","hal_h264e_vepu541_wait",hal);
  }
  return MVar3;
}

Assistant:

static MPP_RET hal_h264e_vepu541_wait(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    HalH264eVepu541Ctx *ctx = (HalH264eVepu541Ctx *)hal;
    H264NaluType type = task->rc_task->frm.is_idr ?  H264_NALU_TYPE_IDR : H264_NALU_TYPE_SLICE;
    MppPacket pkt = task->packet;
    RK_S32 offset = mpp_packet_get_length(pkt);

    hal_h264e_dbg_func("enter %p\n", hal);

    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_POLL, NULL);
    if (ret) {
        mpp_err_f("poll cmd failed %d\n", ret);
        ret = MPP_ERR_VPUHW;
    } else {
        hal_h264e_vepu541_status_check(hal);
        task->hw_length += ctx->regs_ret.st_bsl.bs_lgth;
    }

    mpp_packet_add_segment_info(pkt, type, offset, ctx->regs_ret.st_bsl.bs_lgth);

    {
        HalH264eVepuStreamAmend *amend = &ctx->amend;

        if (amend->enable) {
            amend->old_length = task->hw_length;
            amend->slice->is_multi_slice = (ctx->cfg->split.split_mode > 0);
            h264e_vepu_stream_amend_proc(amend, &ctx->cfg->codec.h264.hw_cfg);
            task->hw_length = amend->new_length;
        } else if (amend->prefix) {
            /* check prefix value */
            amend->old_length = task->hw_length;
            h264e_vepu_stream_amend_sync_ref_idc(amend);
        }
    }
    hal_h264e_dbg_func("leave %p\n", hal);

    return ret;
}